

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cps_conversion.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_26::cps_conversion_helper::cps_convert_lambda
          (cps_conversion_helper *this,Expression *e)

{
  bool bVar1;
  Lambda *pLVar2;
  reference pvVar3;
  reference ip_expr;
  uint64_t index;
  cps_conversion_state local_1e8;
  e_conversion_state local_1b4;
  Expression *local_1b0;
  value_type local_1a8;
  string local_a8;
  undefined1 local_88 [8];
  Variable k;
  Lambda *l;
  Expression *e_local;
  cps_conversion_helper *this_local;
  
  bVar1 = std::
          holds_alternative<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                    (e);
  if (!bVar1) {
    __assert_fail("std::holds_alternative<Lambda>(e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/cps_conversion.cpp"
                  ,0x402,
                  "void skiwi::(anonymous namespace)::cps_conversion_helper::cps_convert_lambda(Expression &)"
                 );
  }
  pLVar2 = std::
           get<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (e);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index);
  k.filename.field_2._8_8_ = *pvVar3 + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->index,(value_type_conflict2 *)(k.filename.field_2._M_local_buf + 8));
  Variable::Variable((Variable *)local_88);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index);
  (anonymous_namespace)::make_var_name_abi_cxx11_(&local_a8,(_anonymous_namespace_ *)*pvVar3,index);
  std::__cxx11::string::operator=((string *)&k,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  ::variant<skiwi::Variable&,void,void,skiwi::Variable,void>
            ((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
              *)&local_1a8,(Variable *)local_88);
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::push_back(&this->continuation,&local_1a8);
  std::
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~variant(&local_1a8);
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->continuation_can_be_moved,true);
  bVar1 = continuation_is_valid(this);
  if (!bVar1) {
    __assert_fail("continuation_is_valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/cps_conversion.cpp"
                  ,0x40d,
                  "void skiwi::(anonymous namespace)::cps_conversion_helper::cps_convert_lambda(Expression &)"
                 );
  }
  local_1b4 = T_STEP_1;
  local_1b0 = e;
  std::
  vector<skiwi::(anonymous_namespace)::cps_conversion_state,std::allocator<skiwi::(anonymous_namespace)::cps_conversion_state>>
  ::
  emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>*,skiwi::(anonymous_namespace)::cps_conversion_state::e_conversion_state>
            ((vector<skiwi::(anonymous_namespace)::cps_conversion_state,std::allocator<skiwi::(anonymous_namespace)::cps_conversion_state>>
              *)&this->expressions_to_treat,&local_1b0,&local_1b4);
  ip_expr = std::
            vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ::front(&pLVar2->body);
  cps_conversion_state::cps_conversion_state(&local_1e8,ip_expr);
  std::
  vector<skiwi::(anonymous_namespace)::cps_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::cps_conversion_state>_>
  ::push_back(&this->expressions_to_treat,&local_1e8);
  cps_conversion_state::~cps_conversion_state(&local_1e8);
  Variable::~Variable((Variable *)local_88);
  return;
}

Assistant:

void cps_convert_lambda(Expression& e)
      {
      cps_assert(std::holds_alternative<Lambda>(e));
      Lambda& l = std::get<Lambda>(e);
      //cps_conversion_visitor ccv;
      //ccv.index = index.back() + 1;
      index.push_back(index.back() + 1);
      Variable k;
      k.name = make_var_name(index.back());
      //ccv.continuation = k;
      continuation.push_back(k);
      continuation_can_be_moved.push_back(true);

      cps_assert(continuation_is_valid());
      //size_t current_size = expressions_to_treat.size();
      expressions_to_treat.emplace_back(&e, cps_conversion_state::e_conversion_state::T_STEP_1);
      expressions_to_treat.push_back(&l.body.front());
      //treat_expressions(current_size);
      //visitor<Expression, cps_conversion_visitor>::visit(l.body.front(), &ccv);
      //index.back() = ccv.index;
      }